

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O1

bool Speed(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined4 uVar28;
  bool bVar29;
  bool bVar30;
  int iVar31;
  uint uVar32;
  const_iterator cVar33;
  mapped_type *pmVar34;
  int *piVar35;
  long *plVar36;
  long lVar37;
  EVP_AEAD *pEVar38;
  EVP_MD *pEVar39;
  EVP_MD *md;
  TRUST_TOKEN_METHOD *pTVar40;
  string *psVar41;
  char *pcVar42;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar43;
  _Alloc_hider _Var44;
  string selected;
  UniquePtr<RSA> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string name;
  uint8_t fake_sha256_hash [32];
  uint sig_len;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_map;
  TimeResults results;
  char *ptr;
  string local_618;
  _Head_base<0UL,_rsa_st_*,_false> local_5f8;
  string local_5f0;
  long *local_5d0;
  long local_5c8;
  long local_5c0 [2];
  ulong local_5b0;
  _Any_data local_5a8;
  undefined1 local_598 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  _Head_base<0UL,_rsa_st_*,_false> local_578;
  code *pcStack_570;
  _Any_data local_568;
  code *local_558;
  code *pcStack_550;
  _Any_data local_548;
  code *local_538;
  code *pcStack_530;
  string local_528;
  string local_508;
  string local_4e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  key_type local_238 [16];
  
  p_Var1 = &local_4c8._M_impl.super__Rb_tree_header;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  bVar29 = ParseKeyValueArguments
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_4c8,args,kArguments);
  if (!bVar29) {
    PrintUsage(kArguments);
    bVar29 = false;
    goto LAB_0012a714;
  }
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-filter","");
  cVar33 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_4c8,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar33._M_node != p_Var1) {
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-filter","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_4c8,local_238);
    std::__cxx11::string::_M_assign((string *)&local_618);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-json","");
  cVar33 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_4c8,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar33._M_node != p_Var1) {
    g_print_json = '\x01';
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-timeout","");
  cVar33 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_4c8,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar33._M_node != p_Var1) {
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-timeout","");
    pmVar34 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_4c8,local_238);
    iVar31 = atoi((pmVar34->_M_dataplus)._M_p);
    g_timeout_seconds = (uint64_t)iVar31;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-threads","");
  cVar33 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_4c8,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar33._M_node != p_Var1) {
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-threads","");
    pmVar34 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_4c8,local_238);
    g_threads = atoi((pmVar34->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-chunks","");
  cVar33 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_4c8,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar33._M_node == p_Var1) {
LAB_001290c0:
    if (g_print_json == '\x01') {
      puts("[");
    }
    if ((local_618._M_string_length == 0) ||
       (lVar37 = std::__cxx11::string::find((char *)&local_618,0x250348,0), lVar37 != -1)) {
      if (SpeedRSA(std::__cxx11::string_const&)::kRSAKeys == '\0') {
        Speed();
      }
      local_508._M_dataplus._M_p = (pointer)0x0;
      paVar43 = &local_5f0.field_2;
      local_5b0 = 0;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d0,
                   (char *)(&SpeedRSA(std::__cxx11::string_const&)::kRSAKeys)
                           [(long)local_508._M_dataplus._M_p * 3],(allocator<char> *)local_238);
        local_5f8._M_head_impl =
             RSA_private_key_from_bytes
                       (*(uint8_t **)(&DAT_00309698 + (long)local_508._M_dataplus._M_p * 0x18),
                        *(size_t *)(&DAT_003096a0 + (long)local_508._M_dataplus._M_p * 0x18));
        if (local_5f8._M_head_impl == (RSA *)0x0) {
          fprintf(_stderr,"Failed to parse %s key.\n",local_5d0);
          ERR_print_errors_fp(_stderr);
          Speed();
          break;
        }
        uVar32 = RSA_size((RSA *)local_5f8._M_head_impl);
        if (0x200 < uVar32) {
          abort();
        }
        local_528.field_2._M_allocated_capacity = 0;
        local_528.field_2._8_8_ = 0;
        local_528._M_dataplus._M_p = (pointer)0x0;
        local_528._M_string_length = 0;
        local_588._M_allocated_capacity = (size_type)&local_5f8;
        local_588._8_8_ = &local_528;
        pcStack_570 = std::
                      _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:333:41)>
                      ::_M_invoke;
        local_578._M_head_impl =
             (rsa_st *)
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:333:41)>
             ::_M_manager;
        bVar29 = TimeFunctionParallel
                           ((TimeResults *)&local_498,(function<bool_()> *)(local_598 + 0x10));
        if (local_578._M_head_impl != (rsa_st *)0x0) {
          (*(code *)local_578._M_head_impl)(local_598 + 0x10,local_598 + 0x10,3);
        }
        if (!bVar29) {
          fwrite("RSA_sign failed.\n",0x11,1,_stderr);
          ERR_print_errors_fp(_stderr);
LAB_001296c5:
          std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_5f8);
          if (local_5d0 != local_5c0) {
            operator_delete(local_5d0,local_5c0[0] + 1);
          }
          break;
        }
        local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_5d0,local_5c8 + (long)local_5d0);
        std::__cxx11::string::append((char *)local_238);
        TimeResults::Print((TimeResults *)&local_498,local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          local_238[0].field_2._M_allocated_capacity + 1);
        }
        iVar31 = RSA_sign(0x2a0,(uchar *)&local_528,0x20,(uchar *)local_238,(uint *)&local_4e8,
                          (RSA *)local_5f8._M_head_impl);
        if (iVar31 == 0) goto LAB_001296c5;
        uVar28 = local_4e8._M_dataplus._M_p._0_4_;
        local_548._M_unused._M_object = (void *)0x0;
        local_548._8_8_ = 0;
        local_538 = (code *)0x0;
        pcStack_530 = (code *)0x0;
        local_548._M_unused._M_object = operator_new(0x20);
        *(_Head_base<0UL,_rsa_st_*,_false> **)local_548._M_unused._0_8_ = &local_5f8;
        *(string **)((long)local_548._M_unused._0_8_ + 8) = &local_528;
        *(key_type **)((long)local_548._M_unused._0_8_ + 0x10) = local_238;
        *(undefined4 *)((long)local_548._M_unused._0_8_ + 0x18) = uVar28;
        pcStack_530 = std::
                      _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:355:23)>
                      ::_M_invoke;
        local_538 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:355:23)>
                    ::_M_manager;
        bVar29 = TimeFunctionParallel((TimeResults *)&local_498,(function<bool_()> *)&local_548);
        if (local_538 != (code *)0x0) {
          (*local_538)(&local_548,&local_548,3);
        }
        if (!bVar29) {
          Speed();
LAB_001296b6:
          ERR_print_errors_fp(_stderr);
          goto LAB_001296c5;
        }
        local_5f0._M_dataplus._M_p = (pointer)paVar43;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5f0,local_5d0,local_5c8 + (long)local_5d0);
        std::__cxx11::string::append((char *)&local_5f0);
        TimeResults::Print((TimeResults *)&local_498,&local_5f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != paVar43) {
          operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        }
        uVar28 = local_4e8._M_dataplus._M_p._0_4_;
        local_568._M_unused._M_object = (void *)0x0;
        local_568._8_8_ = 0;
        local_558 = (code *)0x0;
        pcStack_550 = (code *)0x0;
        local_568._M_unused._M_object = operator_new(0x20);
        *(_Head_base<0UL,_rsa_st_*,_false> **)local_568._M_unused._0_8_ = &local_5f8;
        psVar41 = &local_528;
        *(string **)((long)local_568._M_unused._0_8_ + 8) = psVar41;
        *(key_type **)((long)local_568._M_unused._0_8_ + 0x10) = local_238;
        *(undefined4 *)((long)local_568._M_unused._0_8_ + 0x18) = uVar28;
        pcStack_550 = std::
                      _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:367:23)>
                      ::_M_invoke;
        local_558 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:367:23)>
                    ::_M_manager;
        bVar29 = TimeFunctionParallel((TimeResults *)&local_498,(function<bool_()> *)&local_568);
        if (local_558 != (code *)0x0) {
          (*local_558)(&local_568,&local_568,3);
        }
        if (!bVar29) {
          Speed();
          goto LAB_001296b6;
        }
        local_5f0._M_dataplus._M_p = (pointer)paVar43;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5f0,local_5d0,local_5c8 + (long)local_5d0);
        std::__cxx11::string::append((char *)&local_5f0);
        TimeResults::Print((TimeResults *)&local_498,&local_5f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != paVar43) {
          operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        }
        local_5a8._8_8_ = 0;
        local_5a8._M_unused._M_object = &local_508;
        local_598._8_8_ =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:388:41)>
             ::_M_invoke;
        local_598._0_8_ =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:388:41)>
             ::_M_manager;
        bVar29 = TimeFunctionParallel((TimeResults *)&local_498,(function<bool_()> *)&local_5a8);
        if ((code *)local_598._0_8_ != (code *)0x0) {
          (*(code *)local_598._0_8_)(&local_5a8,&local_5a8,3);
        }
        if (!bVar29) {
          Speed();
          goto LAB_001296b6;
        }
        local_5f0._M_dataplus._M_p = (pointer)paVar43;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5f0,local_5d0,local_5c8 + (long)local_5d0);
        std::__cxx11::string::append((char *)&local_5f0);
        TimeResults::Print((TimeResults *)&local_498,&local_5f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != paVar43) {
          operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        }
        std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_5f8);
        if (local_5d0 != local_5c0) {
          operator_delete(local_5d0,local_5c0[0] + 1);
        }
        local_508._M_dataplus._M_p = local_508._M_dataplus._M_p + 1;
        local_5b0 = CONCAT71((int7)((ulong)psVar41 >> 8),
                             local_508._M_dataplus._M_p >=
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x3);
      } while (local_508._M_dataplus._M_p <
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3);
    }
    else {
      local_5b0 = 0xffffffffffffff01;
    }
    if ((local_5b0 & 1) == 0) {
LAB_0012a131:
      bVar27 = false;
      bVar26 = false;
      bVar25 = false;
      bVar24 = false;
      bVar23 = false;
      bVar22 = false;
      bVar21 = false;
      bVar20 = false;
      bVar19 = false;
      bVar18 = false;
      bVar17 = false;
      bVar16 = false;
      bVar15 = false;
      bVar29 = false;
LAB_0012a244:
      bVar14 = false;
LAB_0012a24c:
      bVar13 = false;
LAB_0012a254:
      bVar12 = false;
LAB_0012a25c:
      bVar11 = false;
LAB_0012a264:
      bVar10 = false;
LAB_0012a266:
      bVar8 = false;
LAB_0012a268:
      bVar7 = false;
LAB_0012a270:
      bVar9 = false;
LAB_0012a273:
      bVar6 = false;
LAB_0012a276:
      bVar5 = false;
LAB_0012a279:
      bVar4 = false;
LAB_0012a27c:
      bVar30 = true;
      bVar3 = false;
      bVar2 = false;
    }
    else {
      pEVar38 = EVP_aead_aegis_128l();
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"AEGIS-128L","");
      bVar29 = SpeedAEAD(pEVar38,local_238,0xd,&local_618);
      if (!bVar29) goto LAB_0012a131;
      pEVar38 = EVP_aead_aegis_128x2();
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"AEGIS-128X2","");
      bVar29 = SpeedAEAD(pEVar38,&local_528,0xd,&local_618);
      if (!bVar29) {
        bVar26 = false;
LAB_0012a1df:
        bVar25 = false;
LAB_0012a1e7:
        bVar24 = false;
LAB_0012a1ef:
        bVar23 = false;
LAB_0012a1f7:
        bVar22 = false;
LAB_0012a1ff:
        bVar21 = false;
LAB_0012a207:
        bVar20 = false;
LAB_0012a20f:
        bVar19 = false;
LAB_0012a217:
        bVar18 = false;
LAB_0012a21f:
        bVar17 = false;
LAB_0012a227:
        bVar16 = false;
LAB_0012a22f:
        bVar15 = false;
LAB_0012a237:
        bVar29 = false;
LAB_0012a23f:
        bVar27 = true;
        goto LAB_0012a244;
      }
      pEVar38 = EVP_aead_aegis_256();
      local_588._M_allocated_capacity = (size_type)&local_578;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_598 + 0x10),"AEGIS-256","");
      bVar29 = SpeedAEAD(pEVar38,(string *)(local_598 + 0x10),0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        goto LAB_0012a1df;
      }
      pEVar38 = EVP_aead_aes_128_gcm();
      local_548._M_unused._M_object = &local_538;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"AES-128-GCM","");
      bVar29 = SpeedAEAD(pEVar38,(string *)&local_548,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        goto LAB_0012a1e7;
      }
      pEVar38 = EVP_aead_aes_256_gcm();
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"AES-256-GCM","");
      bVar29 = SpeedAEAD(pEVar38,&local_5f0,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        goto LAB_0012a1ef;
      }
      pEVar38 = EVP_aead_chacha20_poly1305();
      local_568._M_unused._M_object = &local_558;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"ChaCha20-Poly1305","");
      bVar29 = SpeedAEAD(pEVar38,(string *)&local_568,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        goto LAB_0012a1f7;
      }
      pEVar38 = EVP_aead_des_ede3_cbc_sha1_tls();
      local_5a8._M_unused._M_object = local_598;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"DES-EDE3-CBC-SHA1","");
      bVar29 = SpeedAEAD(pEVar38,(string *)&local_5a8,0xb,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        goto LAB_0012a1ff;
      }
      pEVar38 = EVP_aead_aes_128_cbc_sha1_tls();
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"AES-128-CBC-SHA1","");
      bVar29 = SpeedAEAD(pEVar38,&local_498,0xb,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        goto LAB_0012a207;
      }
      pEVar38 = EVP_aead_aes_256_cbc_sha1_tls();
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"AES-256-CBC-SHA1","");
      bVar29 = SpeedAEAD(pEVar38,&local_508,0xb,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        goto LAB_0012a20f;
      }
      pEVar38 = EVP_aead_aes_128_cbc_sha1_tls();
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"AES-128-CBC-SHA1","");
      bVar29 = SpeedAEADOpen(pEVar38,&local_4e8,0xb,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        goto LAB_0012a217;
      }
      pEVar38 = EVP_aead_aes_256_cbc_sha1_tls();
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"AES-256-CBC-SHA1","");
      bVar29 = SpeedAEADOpen(pEVar38,&local_258,0xb,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        goto LAB_0012a21f;
      }
      pEVar38 = EVP_aead_aes_128_gcm_siv();
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"AES-128-GCM-SIV","");
      bVar29 = SpeedAEAD(pEVar38,&local_278,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        goto LAB_0012a227;
      }
      pEVar38 = EVP_aead_aes_256_gcm_siv();
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"AES-256-GCM-SIV","");
      bVar29 = SpeedAEAD(pEVar38,&local_298,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        goto LAB_0012a22f;
      }
      pEVar38 = EVP_aead_aes_128_gcm_siv();
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"AES-128-GCM-SIV","");
      bVar29 = SpeedAEADOpen(pEVar38,&local_2b8,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        goto LAB_0012a237;
      }
      pEVar38 = EVP_aead_aes_256_gcm_siv();
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"AES-256-GCM-SIV","");
      bVar29 = SpeedAEADOpen(pEVar38,&local_2d8,0xd,&local_618);
      if (!bVar29) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        goto LAB_0012a23f;
      }
      pEVar38 = EVP_aead_aes_128_ccm_bluetooth();
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"AES-128-CCM-Bluetooth","");
      bVar29 = SpeedAEAD(pEVar38,&local_2f8,0xd,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        goto LAB_0012a24c;
      }
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"AES-128","");
      bVar29 = SpeedAESBlock(&local_318,0x80,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        goto LAB_0012a254;
      }
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"AES-256","");
      bVar29 = SpeedAESBlock(&local_338,0x100,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        goto LAB_0012a25c;
      }
      pEVar39 = EVP_sha1();
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"SHA-1","");
      bVar29 = SpeedHash((EVP_MD *)pEVar39,&local_358,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        goto LAB_0012a264;
      }
      pEVar39 = EVP_sha256();
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"SHA-256","");
      bVar29 = SpeedHash((EVP_MD *)pEVar39,&local_378,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        goto LAB_0012a266;
      }
      pEVar39 = EVP_sha512();
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"SHA-512","");
      bVar29 = SpeedHash((EVP_MD *)pEVar39,&local_398,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        goto LAB_0012a268;
      }
      md = EVP_blake2b256();
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"BLAKE2b-256","");
      bVar29 = SpeedHash(md,&local_3b8,&local_618);
      bVar27 = true;
      if ((((((!bVar29) || (bVar29 = SpeedRandom(&local_618), !bVar29)) ||
            (bVar29 = SpeedECDH(&local_618), !bVar29)) ||
           ((bVar29 = SpeedECDSA(&local_618), !bVar29 || (bVar29 = Speed25519(&local_618), !bVar29))
           )) || (((bVar29 = SpeedSPAKE2(&local_618), !bVar29 ||
                   ((bVar29 = SpeedScrypt(&local_618), !bVar29 ||
                    (bVar29 = SpeedRSAKeyGen(&local_618), !bVar29)))) ||
                  (bVar29 = SpeedHRSS(&local_618), !bVar29)))) ||
         ((((bVar29 = SpeedKyber(&local_618), !bVar29 || (bVar29 = SpeedMLDSA(&local_618), !bVar29))
           || (bVar29 = SpeedMLKEM(&local_618), !bVar29)) ||
          (((bVar29 = SpeedMLKEM1024(&local_618), !bVar29 ||
            (bVar29 = SpeedSLHDSA(&local_618), !bVar29)) ||
           (bVar29 = SpeedHashToCurve(&local_618), !bVar29)))))) {
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        goto LAB_0012a270;
      }
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3d8,"TrustToken-Exp1-Batch1","");
      pTVar40 = TRUST_TOKEN_experiment_v1();
      bVar29 = SpeedTrustToken(&local_3d8,pTVar40,1,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        bVar9 = true;
        goto LAB_0012a273;
      }
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"TrustToken-Exp1-Batch10","");
      pTVar40 = TRUST_TOKEN_experiment_v1();
      bVar29 = SpeedTrustToken(&local_3f8,pTVar40,10,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        bVar9 = true;
        bVar6 = true;
        goto LAB_0012a276;
      }
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_418,"TrustToken-Exp2VOPRF-Batch1","");
      pTVar40 = TRUST_TOKEN_experiment_v2_voprf();
      bVar29 = SpeedTrustToken(&local_418,pTVar40,1,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        bVar9 = true;
        bVar6 = true;
        bVar5 = true;
        goto LAB_0012a279;
      }
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_438,"TrustToken-Exp2VOPRF-Batch10","");
      pTVar40 = TRUST_TOKEN_experiment_v2_voprf();
      bVar29 = SpeedTrustToken(&local_438,pTVar40,10,&local_618);
      if (!bVar29) {
        bVar27 = true;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        bVar9 = true;
        bVar6 = true;
        bVar5 = true;
        bVar4 = true;
        goto LAB_0012a27c;
      }
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,"TrustToken-Exp2PMB-Batch1","");
      pTVar40 = TRUST_TOKEN_experiment_v2_pmb();
      bVar29 = SpeedTrustToken(&local_458,pTVar40,1,&local_618);
      if (bVar29) {
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_478,"TrustToken-Exp2PMB-Batch10","");
        pTVar40 = TRUST_TOKEN_experiment_v2_pmb();
        bVar29 = SpeedTrustToken(&local_478,pTVar40,10,&local_618);
        bVar27 = true;
        if ((bVar29) && (bVar29 = SpeedBase64(&local_618), bVar29)) {
          bVar30 = SpeedSipHash(&local_618);
          bVar30 = !bVar30;
        }
        else {
          bVar30 = true;
        }
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        bVar9 = true;
        bVar6 = true;
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
        bVar2 = true;
      }
      else {
        bVar27 = true;
        bVar2 = false;
        bVar26 = true;
        bVar25 = true;
        bVar24 = true;
        bVar23 = true;
        bVar22 = true;
        bVar21 = true;
        bVar20 = true;
        bVar19 = true;
        bVar18 = true;
        bVar17 = true;
        bVar16 = true;
        bVar15 = true;
        bVar29 = true;
        bVar30 = true;
        bVar14 = true;
        bVar13 = true;
        bVar12 = true;
        bVar11 = true;
        bVar10 = true;
        bVar8 = true;
        bVar7 = true;
        bVar9 = true;
        bVar6 = true;
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
      }
    }
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2)) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2)) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2)) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((bVar5) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2)) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if ((bVar6) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2)) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar9) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2)) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar7) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2)) {
      operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar8) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2)) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((bVar10) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2)) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((bVar11) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2)) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    if ((bVar12) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2)) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((bVar13) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2)) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((bVar14) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2)) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar29) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2)) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar15) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2)) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar16) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2)) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((bVar17) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2)) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((bVar18) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2)) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((bVar19) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2)) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar20) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2)) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if ((bVar21) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2)) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    if ((bVar22) && ((string *)local_5a8._M_unused._0_8_ != (string *)local_598)) {
      operator_delete(local_5a8._M_unused._M_object,(ulong)(local_598._0_8_ + 1));
    }
    if ((bVar23) && ((code **)local_568._M_unused._0_8_ != &local_558)) {
      operator_delete(local_568._M_unused._M_object,(ulong)(local_558 + 1));
    }
    if ((bVar24) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2)) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    if ((bVar25) && ((code **)local_548._M_unused._0_8_ != &local_538)) {
      operator_delete(local_548._M_unused._M_object,(ulong)(local_538 + 1));
    }
    if ((bVar26) &&
       ((_Head_base<0UL,_rsa_st_*,_false> *)local_588._M_allocated_capacity != &local_578)) {
      operator_delete((void *)local_588._M_allocated_capacity,
                      (ulong)((long)&(local_578._M_head_impl)->meth + 1));
    }
    if ((bVar27) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2)) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    if (((local_5b0 & 1) != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2)) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
    if (bVar30) {
      bVar29 = false;
    }
    else {
      bVar29 = true;
      if (g_print_json == '\x01') {
        puts("\n]");
      }
    }
  }
  else {
    if (g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-chunks","");
    pmVar34 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_4c8,local_238);
    paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pmVar34->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-chunks","");
    pmVar34 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_4c8,local_238);
    pcVar42 = paVar43->_M_local_buf + pmVar34->_M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
    do {
      if (paVar43 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar42) goto LAB_001290c0;
      piVar35 = __errno_location();
      *piVar35 = 0;
      plVar36 = (long *)strtoull(paVar43->_M_local_buf,(char **)local_238,10);
      _Var44._M_p = local_238[0]._M_dataplus._M_p;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_238[0]._M_dataplus._M_p == paVar43) || (*piVar35 == 0x22)) {
        Speed();
        bVar29 = false;
        _Var44._M_p = (pointer)paVar43;
      }
      else {
        local_5d0 = plVar36;
        if (g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&g_chunk_lengths,
                     (iterator)
                     g_chunk_lengths.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(unsigned_long *)&local_5d0);
        }
        else {
          *g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish = (unsigned_long)plVar36;
          g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        bVar29 = true;
        if (_Var44._M_p != pcVar42) {
          if (*_Var44._M_p == ',') {
            _Var44._M_p = _Var44._M_p + 1;
          }
          else {
            Speed();
            bVar29 = false;
          }
        }
      }
      paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var44._M_p;
    } while (bVar29);
    bVar29 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
LAB_0012a714:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4c8);
  return bVar29;
}

Assistant:

bool Speed(const std::vector<std::string> &args) {
  std::map<std::string, std::string> args_map;
  if (!ParseKeyValueArguments(&args_map, args, kArguments)) {
    PrintUsage(kArguments);
    return false;
  }

  std::string selected;
  if (args_map.count("-filter") != 0) {
    selected = args_map["-filter"];
  }

  if (args_map.count("-json") != 0) {
    g_print_json = true;
  }

  if (args_map.count("-timeout") != 0) {
    g_timeout_seconds = atoi(args_map["-timeout"].c_str());
  }

#if defined(OPENSSL_THREADS)
  if (args_map.count("-threads") != 0) {
    g_threads = atoi(args_map["-threads"].c_str());
  }
#endif

  if (args_map.count("-chunks") != 0) {
    g_chunk_lengths.clear();
    const char *start = args_map["-chunks"].data();
    const char *end = start + args_map["-chunks"].size();
    while (start != end) {
      errno = 0;
      char *ptr;
      unsigned long long val = strtoull(start, &ptr, 10);
      if (ptr == start /* no numeric characters found */ ||
          errno == ERANGE /* overflow */ || static_cast<size_t>(val) != val) {
        fprintf(stderr, "Error parsing -chunks argument\n");
        return false;
      }
      g_chunk_lengths.push_back(static_cast<size_t>(val));
      start = ptr;
      if (start != end) {
        if (*start != ',') {
          fprintf(stderr, "Error parsing -chunks argument\n");
          return false;
        }
        start++;
      }
    }
  }

  // kTLSADLen is the number of bytes of additional data that TLS passes to
  // AEADs.
  static const size_t kTLSADLen = 13;
  // kLegacyADLen is the number of bytes that TLS passes to the "legacy" AEADs.
  // These are AEADs that weren't originally defined as AEADs, but which we use
  // via the AEAD interface. In order for that to work, they have some TLS
  // knowledge in them and construct a couple of the AD bytes internally.
  static const size_t kLegacyADLen = kTLSADLen - 2;

  if (g_print_json) {
    puts("[");
  }
  if (!SpeedRSA(selected) ||
      !SpeedAEAD(EVP_aead_aegis_128l(), "AEGIS-128L", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_128x2(), "AEGIS-128X2", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_256(), "AEGIS-256", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm(), "AES-128-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm(), "AES-256-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_chacha20_poly1305(), "ChaCha20-Poly1305", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_des_ede3_cbc_sha1_tls(), "DES-EDE3-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEAD(EVP_aead_aes_128_ccm_bluetooth(), "AES-128-CCM-Bluetooth",
                 kTLSADLen, selected) ||
      !SpeedAESBlock("AES-128", 128, selected) ||
      !SpeedAESBlock("AES-256", 256, selected) ||
      !SpeedHash(EVP_sha1(), "SHA-1", selected) ||
      !SpeedHash(EVP_sha256(), "SHA-256", selected) ||
      !SpeedHash(EVP_sha512(), "SHA-512", selected) ||
      !SpeedHash(EVP_blake2b256(), "BLAKE2b-256", selected) ||
      !SpeedRandom(selected) ||       //
      !SpeedECDH(selected) ||         //
      !SpeedECDSA(selected) ||        //
      !Speed25519(selected) ||        //
      !SpeedSPAKE2(selected) ||       //
      !SpeedScrypt(selected) ||       //
      !SpeedRSAKeyGen(selected) ||    //
      !SpeedHRSS(selected) ||         //
      !SpeedKyber(selected) ||        //
      !SpeedMLDSA(selected) ||        //
      !SpeedMLKEM(selected) ||        //
      !SpeedMLKEM1024(selected) ||    //
      !SpeedSLHDSA(selected) ||       //
      !SpeedHashToCurve(selected) ||  //
      !SpeedTrustToken("TrustToken-Exp1-Batch1", TRUST_TOKEN_experiment_v1(), 1,
                       selected) ||
      !SpeedTrustToken("TrustToken-Exp1-Batch10", TRUST_TOKEN_experiment_v1(),
                       10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch1",
                       TRUST_TOKEN_experiment_v2_voprf(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch10",
                       TRUST_TOKEN_experiment_v2_voprf(), 10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch1",
                       TRUST_TOKEN_experiment_v2_pmb(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch10",
                       TRUST_TOKEN_experiment_v2_pmb(), 10, selected) ||
      !SpeedBase64(selected) ||  //
      !SpeedSipHash(selected)) {
    return false;
  }
#if defined(BORINGSSL_FIPS)
  if (!SpeedSelfTest(selected)) {
    return false;
  }
#endif
  if (g_print_json) {
    puts("\n]");
  }

  return true;
}